

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O1

int resolve_schema_nodeid
              (char *nodeid,lys_node *start_parent,lys_module *cur_module,ly_set **ret,int extended,
              int no_node_error)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  size_t sVar7;
  lys_node *last;
  lys_node *sibling;
  lys_module *plVar8;
  ly_set *plVar9;
  lys_node *plVar10;
  lys_node *plVar11;
  lys_node *plVar12;
  char *pcVar13;
  LY_ECODE ecode;
  ly_ctx *ctx;
  undefined4 in_register_00000084;
  ulong uVar14;
  undefined8 uVar15;
  int *all_desc_00;
  char *pcVar16;
  char *pcVar17;
  lys_node *plVar18;
  char *local_e0;
  ly_set **local_d8;
  int local_cc;
  char *pcStack_c8;
  int nam_len_1;
  char *model;
  char *local_b8;
  lys_module *local_b0;
  int local_a8;
  int local_a4;
  int mod_len;
  int has_predicate_1;
  int all_desc;
  char *name;
  int local_84;
  int iStack_80;
  int has_predicate;
  char *local_78;
  lys_node *local_70;
  char *local_68;
  char *mod_name;
  lys_module *local_58;
  int local_4c;
  int local_48;
  int nam_len;
  int is_relative;
  int local_38;
  byte local_31;
  int mod_name_len;
  char *pcVar6;
  
  name = (char *)CONCAT44(in_register_00000084,extended);
  local_38 = 0;
  local_48 = -1;
  if (((nodeid == (char *)0x0) ||
      (start_parent == (lys_node *)0x0 && cur_module == (lys_module *)0x0)) ||
     (ret == (ly_set **)0x0)) {
    __assert_fail("nodeid && (start_parent || cur_module) && ret",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                  ,0x766,
                  "int resolve_schema_nodeid(const char *, const struct lys_node *, const struct lys_module *, struct ly_set **, int, int)"
                 );
  }
  *ret = (ly_set *)0x0;
  local_70 = start_parent;
  if (cur_module == (lys_module *)0x0) {
    cur_module = lys_node_module(start_parent);
  }
  ctx = cur_module->ctx;
  local_58 = cur_module;
  uVar3 = parse_schema_nodeid(nodeid,&local_68,&local_38,(char **)&all_desc,&local_4c,&local_48,
                              (int *)0x0,(int *)0x0,1);
  if ((int)uVar3 < 1) {
    _all_desc = nodeid + -uVar3;
    cVar1 = nodeid[-uVar3];
LAB_00113941:
    uVar14 = (ulong)(uint)(int)cVar1;
LAB_0011394a:
    ly_vlog(ctx,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,uVar14,_all_desc);
  }
  else {
    if (*_all_desc == '#') {
      if (local_48 == 0) {
        pcVar16 = _all_desc + 1;
        _iStack_80 = (lys_node *)CONCAT44(has_predicate,local_4c + -1);
        pcVar17 = local_68;
        pcVar13 = nodeid + uVar3;
        iVar5 = local_38;
        goto LAB_00113245;
      }
      uVar14 = 0x23;
      goto LAB_0011394a;
    }
    local_48 = -1;
    pcVar17 = (char *)0x0;
    pcVar16 = (char *)0x0;
    iVar5 = 0;
    pcVar13 = nodeid;
LAB_00113245:
    all_desc_00 = &mod_len;
    if ((int)name == 0) {
      all_desc_00 = (int *)0x0;
    }
    local_b8 = nodeid;
    has_predicate_1 = no_node_error;
    _is_relative = ctx;
    iVar4 = parse_schema_nodeid(pcVar13,&local_68,&local_38,(char **)&all_desc,&local_4c,&local_48,
                                &local_84,all_desc_00,(int)name);
    pcVar6 = (char *)CONCAT44(extraout_var,iVar4);
    if (iVar4 < 1) {
      _all_desc = pcVar13 + (uint)-iVar4;
      cVar1 = pcVar13[(uint)-iVar4];
      ctx = _is_relative;
      goto LAB_00113941;
    }
    if (pcVar17 != (char *)0x0) {
      local_68 = pcVar17;
      local_38 = iVar5;
    }
    mod_name = pcVar6;
    if (local_48 != 0 && local_70 == (lys_node *)0x0) {
      pcVar17 = (char *)0xffffffff;
      ly_vlog(_is_relative,LYE_SPEC,LY_VLOG_STR,local_b8,
              "Starting node must be provided for relative paths.");
      goto LAB_00113957;
    }
    if (local_48 != 0) {
      local_58 = lys_node_module(local_70);
      plVar12 = local_70;
      model = (char *)local_58;
      goto LAB_001132de;
    }
    model = (char *)lyp_get_module(local_58,(char *)0x0,0,local_68,local_38,0);
    if ((lys_module *)model == (lys_module *)0x0) {
LAB_00113a5e:
      pcVar17 = strndup(local_68,(long)local_38);
      ecode = LYE_PATH_INMOD;
    }
    else {
      if (pcVar16 == (char *)0x0) {
        plVar12 = (lys_node *)0x0;
LAB_001132de:
        local_78 = pcVar13 + ((ulong)mod_name & 0xffffffff);
        nam_len = 0;
        local_b0 = (lys_module *)0x0;
        pcVar17 = mod_name;
        local_d8 = ret;
        do {
          iVar5 = local_38;
          pcVar13 = local_68;
          if (plVar12 == (lys_node *)0x0) {
            plVar12 = (lys_node *)0x0;
            last = (lys_node *)0x0;
            goto LAB_001133a5;
          }
          local_b0 = local_58;
          if (local_68 != (char *)0x0) {
            pcVar16 = local_58->name;
            iVar4 = strncmp(local_68,pcVar16,(long)local_38);
            if (iVar4 == 0) {
              sVar7 = strlen(pcVar16);
              local_b0 = local_58;
              if (iVar5 == (int)sVar7) goto LAB_00113380;
            }
            local_b0 = lyp_get_module(local_58,(char *)0x0,0,pcVar13,iVar5,0);
            if (local_b0 == (lys_module *)0x0) goto LAB_00113a5e;
          }
LAB_00113380:
          last = (lys_node *)0x0;
          ret = local_d8;
          if ((int)name != 0) goto LAB_001133a5;
LAB_00113876:
          last = (lys_node *)lys_getnext_target_aug((lys_node_augment *)last,local_b0,plVar12);
LAB_001133a5:
          plVar10 = last;
          if (last == (lys_node *)0x0) {
            plVar10 = plVar12;
          }
          sibling = lys_getnext((lys_node *)0x0,plVar10,(lys_module *)model,0x18b);
          plVar11 = plVar10;
          plVar18 = _iStack_80;
          while (_iStack_80 = plVar11, bVar2 = sibling == (lys_node *)0x0, !(bool)bVar2) {
            local_70 = plVar12;
            local_31 = bVar2;
            uVar3 = schema_nodeid_siblingcheck
                              (sibling,local_58,local_68,local_38,_all_desc,local_4c);
            pcVar17 = (char *)(ulong)uVar3;
            if ((((int)name == 0) || (uVar3 != 3 && (uVar3 & 0xfffffffd) != 0)) || (local_84 == 0))
            {
              if (*local_78 == '\0') {
                nam_len = 1;
              }
LAB_00113597:
              switch(pcVar17) {
              case (char *)0x0:
                if (nam_len == 0) {
                  pcVar17 = (char *)0x0;
                  plVar12 = sibling;
                  bVar2 = local_31;
                  plVar18 = _iStack_80;
                  if ((sibling->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN)
                  goto LAB_00113951;
                }
                else {
                  plVar9 = ly_set_new();
                  *ret = plVar9;
                  if (plVar9 == (ly_set *)0x0) {
LAB_00113a93:
                    ly_log(_is_relative,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                           "resolve_schema_nodeid");
                    goto LAB_00113951;
                  }
                  ly_set_add(plVar9,sibling,1);
                  pcVar17 = (char *)0x0;
                  plVar12 = local_70;
                  bVar2 = local_31;
                  plVar18 = _iStack_80;
                }
                goto LAB_00113806;
              case (char *)0x1:
                break;
              case (char *)0x2:
                if (*ret == (ly_set *)0x0) {
                  plVar9 = ly_set_new();
                  *ret = plVar9;
                  if (plVar9 == (ly_set *)0x0) goto LAB_00113a93;
                }
                ly_set_add(*ret,sibling,1);
                plVar12 = sibling;
                if (mod_len != 0) {
                  do {
                    mod_name = pcVar17;
                    if (plVar12 != sibling) {
                      ly_set_add(*ret,plVar12,1);
                    }
                    if ((plVar12->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
                      plVar18 = plVar12->child;
                    }
                    else {
                      plVar18 = (lys_node *)0x0;
                    }
                    if (plVar18 != (lys_node *)0x0) goto LAB_0011362f;
                    pcVar17 = mod_name;
                    plVar10 = _iStack_80;
                    if (plVar12 == sibling) break;
                    do {
                      plVar18 = plVar12->next;
LAB_0011362f:
                      if (plVar18 != (lys_node *)0x0) break;
                      plVar12 = plVar12->parent;
                      if (plVar12->nodetype == LYS_AUGMENT) {
                        plVar12 = plVar12->prev;
                      }
                      plVar10 = lys_parent(plVar12);
                      plVar11 = lys_parent(sibling);
                    } while (plVar10 != plVar11);
                    plVar12 = plVar18;
                    pcVar17 = mod_name;
                    plVar10 = _iStack_80;
                  } while (plVar18 != (lys_node *)0x0);
                }
                break;
              case (char *)0x3:
                if (*ret == (ly_set *)0x0) {
                  plVar9 = ly_set_new();
                  *ret = plVar9;
                  if (plVar9 == (ly_set *)0x0) goto LAB_00113a93;
                  if (local_70 != (lys_node *)0x0) {
                    ly_set_add(plVar9,local_70,1);
                  }
                }
                ly_set_add(*ret,sibling,1);
                plVar12 = sibling;
                if (mod_len != 0) {
                  do {
                    mod_name = pcVar17;
                    if (plVar12 != sibling) {
                      ly_set_add(*ret,plVar12,1);
                    }
                    if ((plVar12->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
                      plVar18 = plVar12->child;
                    }
                    else {
                      plVar18 = (lys_node *)0x0;
                    }
                    if (plVar18 != (lys_node *)0x0) goto LAB_001136fe;
                    pcVar17 = mod_name;
                    plVar10 = _iStack_80;
                    if (plVar12 == sibling) break;
                    do {
                      plVar18 = plVar12->next;
LAB_001136fe:
                      if (plVar18 != (lys_node *)0x0) break;
                      plVar12 = plVar12->parent;
                      if (plVar12->nodetype == LYS_AUGMENT) {
                        plVar12 = plVar12->prev;
                      }
                      plVar10 = lys_parent(plVar12);
                      plVar11 = lys_parent(sibling);
                    } while (plVar10 != plVar11);
                    plVar12 = plVar18;
                    pcVar17 = mod_name;
                    plVar10 = _iStack_80;
                  } while (plVar18 != (lys_node *)0x0);
                }
                break;
              default:
                uVar15 = 0x80e;
                goto LAB_00113a52;
              }
            }
            else {
              pcVar17 = &DAT_00000001;
              pcVar13 = local_78;
              if ((sibling->nodetype & (LYS_LIST|LYS_LEAFLIST)) != LYS_UNKNOWN) {
                do {
                  pcVar17 = &DAT_00000001;
                  uVar3 = parse_schema_json_predicate
                                    (pcVar13,&stack0xffffffffffffff38,&local_a8,&local_e0,&local_cc,
                                     (char **)0x0,(int *)0x0,&local_a4);
                  if ((int)uVar3 < 1) {
                    ly_vlog(local_58->ctx,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,
                            (ulong)(uint)(int)pcVar13[(int)uVar3],pcVar13 + (int)uVar3);
                    pcVar17 = (char *)0xffffffff;
                    goto LAB_001137c2;
                  }
                  pcVar13 = pcVar13 + uVar3;
                  if (sibling->nodetype == LYS_LEAFLIST) {
                    if (((local_e0 == (char *)0x0 || pcStack_c8 != (char *)0x0) ||
                        (*local_e0 != '.')) || (local_a4 != 0)) goto LAB_001137c2;
                    break;
                  }
                  if (sibling->padding[2] == '\0') {
                    uVar3 = 0;
                  }
                  else {
                    uVar14 = 0;
                    mod_name = pcVar13;
                    do {
                      plVar12 = *(lys_node **)(*(long *)&sibling[1].flags + uVar14 * 8);
                      pcVar17 = plVar12->name;
                      sVar7 = (size_t)local_cc;
                      iVar5 = strncmp(pcVar17,local_e0,sVar7);
                      pcVar13 = pcStack_c8;
                      if ((iVar5 == 0) && (pcVar17[sVar7] == '\0')) {
                        plVar8 = lys_node_module(plVar12);
                        if (pcVar13 == (char *)0x0) {
                          if (plVar8 == local_58) break;
                        }
                        else {
                          iVar5 = strncmp(plVar8->name,pcStack_c8,(long)local_a8);
                          if ((iVar5 == 0) &&
                             (plVar8 = lys_node_module(*(lys_node **)
                                                        (*(long *)&sibling[1].flags + uVar14 * 8)),
                             plVar8->name[local_a8] == '\0')) break;
                        }
                      }
                      uVar14 = uVar14 + 1;
                    } while (uVar14 < sibling->padding[2]);
                    uVar3 = (uint)uVar14;
                    pcVar13 = mod_name;
                    ret = local_d8;
                    plVar10 = _iStack_80;
                  }
                  if (uVar3 == sibling->padding[2]) {
                    pcVar17 = &DAT_00000001;
                    goto LAB_001137c2;
                  }
                } while (local_a4 != 0);
                if (*pcVar13 == '\0') {
                  nam_len = 1;
                }
                pcVar17 = (char *)0x0;
              }
LAB_001137c2:
              if ((int)pcVar17 != 1) {
                if ((int)pcVar17 != -1) goto LAB_00113597;
                goto LAB_00113957;
              }
            }
            sibling = lys_getnext(sibling,plVar10,(lys_module *)model,0x18b);
            plVar12 = local_70;
            plVar11 = _iStack_80;
            plVar18 = _iStack_80;
          }
LAB_00113806:
          _iStack_80 = plVar18;
          pcVar13 = local_78;
          if ((((int)name != 0) && (local_84 != 0)) && (*local_78 == '[')) {
LAB_00113820:
            pcVar16 = strchr(pcVar13,0x5d);
            if (pcVar16 != (char *)0x0) goto code_r0x00113833;
            uVar15 = 0x818;
LAB_00113a52:
            ly_log(_is_relative,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                   ,uVar15);
            goto LAB_00113951;
          }
LAB_00113847:
          if (((nam_len != 0) && ((uint)pcVar17 < 4)) && ((uint)pcVar17 != 1)) goto LAB_00113b03;
          local_78 = pcVar13;
          if ((bVar2 & 1) != 0) goto code_r0x00113866;
          uVar3 = parse_schema_nodeid(pcVar13,&local_68,&local_38,(char **)&all_desc,&local_4c,
                                      &local_48,&local_84,all_desc_00,(int)name);
          pcVar17 = (char *)(ulong)uVar3;
          if ((int)uVar3 < 1) {
            _all_desc = pcVar13 + -uVar3;
            cVar1 = pcVar13[-uVar3];
            ctx = _is_relative;
            goto LAB_00113941;
          }
          local_78 = pcVar13 + (long)pcVar17;
        } while( true );
      }
      iVar5 = iStack_80;
      plVar12 = lyp_get_yang_data_template((lys_module *)model,pcVar16,iStack_80);
      if (plVar12 != (lys_node *)0x0) goto LAB_001132de;
      _all_desc = pcVar16 + ((long)iVar5 - (long)local_b8);
LAB_001139ff:
      pcVar17 = strndup(local_b8,(size_t)_all_desc);
      ecode = LYE_PATH_INNODE;
    }
    ly_vlog(_is_relative,ecode,LY_VLOG_STR,pcVar17);
    free(pcVar17);
  }
LAB_00113951:
  pcVar17 = (char *)0xffffffff;
LAB_00113957:
  return (int)pcVar17;
code_r0x00113833:
  pcVar13 = pcVar16 + 1;
  if (pcVar16[1] != '[') goto LAB_00113847;
  goto LAB_00113820;
code_r0x00113866:
  if (last == (lys_node *)0x0) {
    if (has_predicate_1 != 0) {
      _all_desc = _all_desc + ((long)local_4c - (long)local_b8);
      goto LAB_001139ff;
    }
    *ret = (ly_set *)0x0;
LAB_00113b03:
    pcVar17 = (char *)0x0;
    goto LAB_00113957;
  }
  goto LAB_00113876;
}

Assistant:

int
resolve_schema_nodeid(const char *nodeid, const struct lys_node *start_parent, const struct lys_module *cur_module,
                      struct ly_set **ret, int extended, int no_node_error)
{
    const char *name, *mod_name, *id, *backup_mod_name = NULL, *yang_data_name = NULL;
    const struct lys_node *sibling, *next, *elem;
    struct lys_node_augment *last_aug;
    int r, nam_len, mod_name_len = 0, is_relative = -1, all_desc, has_predicate, nodeid_end = 0;
    int yang_data_name_len, backup_mod_name_len = 0;
    /* resolved import module from the start module, it must match the next node-name-match sibling */
    const struct lys_module *start_mod, *aux_mod = NULL;
    char *str;
    struct ly_ctx *ctx;

    assert(nodeid && (start_parent || cur_module) && ret);
    *ret = NULL;

    if (!cur_module) {
        cur_module = lys_node_module(start_parent);
    }
    ctx = cur_module->ctx;
    id = nodeid;

    r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, NULL, NULL, 1);
    if (r < 1) {
        LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
        return -1;
    }

    if (name[0] == '#') {
        if (is_relative) {
            LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, '#', name);
            return -1;
        }
        yang_data_name = name + 1;
        yang_data_name_len = nam_len - 1;
        backup_mod_name = mod_name;
        backup_mod_name_len = mod_name_len;
        id += r;
    } else {
        is_relative = -1;
    }

    r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, &has_predicate,
                            (extended ? &all_desc : NULL), extended);
    if (r < 1) {
        LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
        return -1;
    }
    id += r;

    if (backup_mod_name) {
        mod_name = backup_mod_name;
        mod_name_len = backup_mod_name_len;
    }

    if (is_relative && !start_parent) {
        LOGVAL(ctx, LYE_SPEC, LY_VLOG_STR, nodeid, "Starting node must be provided for relative paths.");
        return -1;
    }

    /* descendant-schema-nodeid */
    if (is_relative) {
        cur_module = start_mod = lys_node_module(start_parent);

    /* absolute-schema-nodeid */
    } else {
        start_mod = lyp_get_module(cur_module, NULL, 0, mod_name, mod_name_len, 0);
        if (!start_mod) {
            str = strndup(mod_name, mod_name_len);
            LOGVAL(ctx, LYE_PATH_INMOD, LY_VLOG_STR, str);
            free(str);
            return -1;
        }
        start_parent = NULL;
        if (yang_data_name) {
            start_parent = lyp_get_yang_data_template(start_mod, yang_data_name, yang_data_name_len);
            if (!start_parent) {
                str = strndup(nodeid, (yang_data_name + yang_data_name_len) - nodeid);
                LOGVAL(ctx, LYE_PATH_INNODE, LY_VLOG_STR, str);
                free(str);
                return -1;
            }
        }
    }

    while (1) {
        sibling = NULL;
        last_aug = NULL;

        if (start_parent) {
            if (mod_name && (strncmp(mod_name, cur_module->name, mod_name_len)
                    || (mod_name_len != (signed)strlen(cur_module->name)))) {
                /* we are getting into another module (augment) */
                aux_mod = lyp_get_module(cur_module, NULL, 0, mod_name, mod_name_len, 0);
                if (!aux_mod) {
                    str = strndup(mod_name, mod_name_len);
                    LOGVAL(ctx, LYE_PATH_INMOD, LY_VLOG_STR, str);
                    free(str);
                    return -1;
                }
            } else {
                /* there is no mod_name, so why are we checking augments again?
                 * because this module may be not implemented and it augments something in another module and
                 * there is another augment augmenting that previous one */
                aux_mod = cur_module;
            }

            /* look into augments */
            if (!extended) {
get_next_augment:
                last_aug = lys_getnext_target_aug(last_aug, aux_mod, start_parent);
            }
        }

        while ((sibling = lys_getnext(sibling, (last_aug ? (struct lys_node *)last_aug : start_parent), start_mod,
                LYS_GETNEXT_WITHCHOICE | LYS_GETNEXT_WITHCASE | LYS_GETNEXT_WITHINOUT | LYS_GETNEXT_PARENTUSES | LYS_GETNEXT_NOSTATECHECK))) {
            r = schema_nodeid_siblingcheck(sibling, cur_module, mod_name, mod_name_len, name, nam_len);

            /* resolve predicate */
            if (extended && ((r == 0) || (r == 2) || (r == 3)) && has_predicate) {
                r = resolve_extended_schema_nodeid_predicate(id, sibling, cur_module, &nodeid_end);
                if (r == 1) {
                    continue;
                } else if (r == -1) {
                    return -1;
                }
            } else if (!id[0]) {
                nodeid_end = 1;
            }

            if (r == 0) {
                /* one matching result */
                if (nodeid_end) {
                    *ret = ly_set_new();
                    LY_CHECK_ERR_RETURN(!*ret, LOGMEM(ctx), -1);
                    ly_set_add(*ret, (void *)sibling, LY_SET_OPT_USEASLIST);
                } else {
                    if (sibling->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA)) {
                        return -1;
                    }
                    start_parent = sibling;
                }
                break;
            } else if (r == 1) {
                continue;
            } else if (r == 2) {
                /* "*" */
                if (!*ret) {
                    *ret = ly_set_new();
                    LY_CHECK_ERR_RETURN(!*ret, LOGMEM(ctx), -1);
                }
                ly_set_add(*ret, (void *)sibling, LY_SET_OPT_USEASLIST);
                if (all_desc) {
                    LY_TREE_DFS_BEGIN(sibling, next, elem) {
                        if (elem != sibling) {
                            ly_set_add(*ret, (void *)elem, LY_SET_OPT_USEASLIST);
                        }

                        LY_TREE_DFS_END(sibling, next, elem);
                    }
                }
            } else if (r == 3) {
                /* "." */
                if (!*ret) {
                    *ret = ly_set_new();
                    LY_CHECK_ERR_RETURN(!*ret, LOGMEM(ctx), -1);
                    if (start_parent) {
                        ly_set_add(*ret, (void *)start_parent, LY_SET_OPT_USEASLIST);
                    }
                }
                ly_set_add(*ret, (void *)sibling, LY_SET_OPT_USEASLIST);
                if (all_desc) {
                    LY_TREE_DFS_BEGIN(sibling, next, elem) {
                        if (elem != sibling) {
                            ly_set_add(*ret, (void *)elem, LY_SET_OPT_USEASLIST);
                        }

                        LY_TREE_DFS_END(sibling, next, elem);
                    }
                }
            } else {
                LOGINT(ctx);
                return -1;
            }
        }

        /* skip predicate */
        if (extended && has_predicate) {
            while (id[0] == '[') {
                id = strchr(id, ']');
                if (!id) {
                    LOGINT(ctx);
                    return -1;
                }
                ++id;
            }
        }

        if (nodeid_end && ((r == 0) || (r == 2) || (r == 3))) {
            return EXIT_SUCCESS;
        }

        /* no match */
        if (!sibling) {
            if (last_aug) {
                /* it still could be in another augment */
                goto get_next_augment;
            }
            if (no_node_error) {
                str = strndup(nodeid, (name - nodeid) + nam_len);
                LOGVAL(ctx, LYE_PATH_INNODE, LY_VLOG_STR, str);
                free(str);
                return -1;
            }
            *ret = NULL;
            return EXIT_SUCCESS;
        }

        r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, &has_predicate,
                                (extended ? &all_desc : NULL), extended);
        if (r < 1) {
            LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
            return -1;
        }
        id += r;
    }

    /* cannot get here */
    LOGINT(ctx);
    return -1;
}